

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

int AMPLSLoadNLModel(AMPLS_MP_Solver *slv,char *nl_filename,char **options)

{
  anon_class_24_3_49e72a80 fn;
  int iVar1;
  undefined8 in_RSI;
  AMPLS_MP_Solver *in_RDI;
  char **unaff_retaddr;
  
  fn.slv = in_RDI;
  fn.nl_filename = (char *)in_RSI;
  fn.options = unaff_retaddr;
  iVar1 = AMPLS__internal__TryCatchWrapper<AMPLSLoadNLModel::__0>(in_RDI,fn);
  return iVar1;
}

Assistant:

int AMPLSLoadNLModel(AMPLS_MP_Solver* slv,
                     const char* nl_filename,
                     char** options) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    std::string nl_filename_ = nl_filename;
    auto filename_no_ext_ = nl_filename_;
    const char *ext = std::strrchr(nl_filename, '.');
    if (!ext || std::strcmp(ext, ".nl") != 0)
      nl_filename_ += ".nl";
    else
      filename_no_ext_.resize(filename_no_ext_.size() - 3);

    auto be = AMPLSGetBackend(slv);
    be->ReadNL(nl_filename, filename_no_ext_, options);
    be->InputExtras();
  } );
}